

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

int32_t ucnv_extMatchFromU(int32_t *cx,UChar32 firstCP,UChar *pre,int32_t preLength,UChar *src,
                          int32_t srcLength,uint32_t *pMatchValue,UBool useFallback,UBool flush)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint32_t value_00;
  UBool UVar4;
  int32_t iVar5;
  ushort *puVar6;
  uint32_t *puVar7;
  UChar local_96;
  int local_94;
  UChar c;
  int32_t matchLength;
  int32_t length;
  int32_t idx;
  int32_t j;
  int32_t i;
  uint32_t matchValue;
  uint32_t value;
  uint32_t *fromUSectionValues;
  uint32_t *fromUTableValues;
  UChar *fromUSectionUChars;
  UChar *fromUTableUChars;
  uint32_t *stage3b;
  uint16_t *stage3;
  uint16_t *stage12;
  int32_t srcLength_local;
  UChar *src_local;
  int32_t preLength_local;
  UChar *pre_local;
  UChar32 firstCP_local;
  int32_t *cx_local;
  
  if (cx == (int32_t *)0x0) {
    cx_local._4_4_ = 0;
  }
  else if (firstCP >> 10 < cx[0xb]) {
    matchLength = *(uint *)((long)cx +
                           (long)(int)(uint)*(ushort *)
                                             ((long)cx +
                                             (long)(int)((uint)*(ushort *)
                                                                ((long)cx +
                                                                (long)(int)((uint)*(ushort *)
                                                                                   ((long)cx +
                                                                                   (long)(firstCP >>
                                                                                         10) * 2 +
                                                                                   (long)cx[10]) +
                                                                           (firstCP >> 4 & 0x3fU)) *
                                                                2 + (long)cx[10]) * 4 +
                                                        (firstCP & 0xfU)) * 2 + (long)cx[0xd]) * 4 +
                           (long)cx[0xf]);
    if (matchLength == 0) {
      cx_local._4_4_ = 0;
    }
    else {
      if ((uint)matchLength < 0x1f0000) {
        iVar2 = cx[5];
        iVar3 = cx[6];
        j = 0;
        local_94 = 0;
        length = 0;
        idx = 0;
        do {
          puVar6 = (ushort *)((long)cx + (long)matchLength * 2 + (long)iVar2);
          puVar7 = (uint32_t *)((long)cx + (long)matchLength * 4 + (long)iVar3);
          uVar1 = *puVar6;
          value_00 = *puVar7;
          if ((value_00 != 0) &&
             (UVar4 = extFromUUseMapping(useFallback,value_00,firstCP), UVar4 != '\0')) {
            local_94 = idx + 2 + length;
            j = value_00;
          }
          if (idx < preLength) {
            local_96 = pre[idx];
            idx = idx + 1;
          }
          else {
            if (srcLength <= length) {
              if ((flush == '\0') && (idx + length < 0x14)) {
                return -(idx + length + 2);
              }
              goto LAB_004cd7ca;
            }
            local_96 = src[length];
            length = length + 1;
          }
          iVar5 = ucnv_extFindFromU((UChar *)(puVar6 + 1),(uint)uVar1,local_96);
          if (iVar5 < 0) goto LAB_004cd7ca;
          matchLength = puVar7[(long)iVar5 + 1];
        } while ((uint)matchLength >> 0x18 == 0);
        UVar4 = extFromUUseMapping(useFallback,matchLength,firstCP);
        if (UVar4 != '\0') {
          local_94 = idx + 2 + length;
          j = matchLength;
        }
LAB_004cd7ca:
        if (local_94 == 0) {
          return 0;
        }
      }
      else {
        UVar4 = extFromUUseMapping(useFallback,matchLength,firstCP);
        if (UVar4 == '\0') {
          return 0;
        }
        local_94 = 2;
        j = matchLength;
      }
      if (j == -0x7fffffff) {
        cx_local._4_4_ = 1;
      }
      else {
        *pMatchValue = j;
        cx_local._4_4_ = local_94;
      }
    }
  }
  else {
    cx_local._4_4_ = 0;
  }
  return cx_local._4_4_;
}

Assistant:

static int32_t
ucnv_extMatchFromU(const int32_t *cx,
                   UChar32 firstCP,
                   const UChar *pre, int32_t preLength,
                   const UChar *src, int32_t srcLength,
                   uint32_t *pMatchValue,
                   UBool useFallback, UBool flush) {
    const uint16_t *stage12, *stage3;
    const uint32_t *stage3b;

    const UChar *fromUTableUChars, *fromUSectionUChars;
    const uint32_t *fromUTableValues, *fromUSectionValues;

    uint32_t value, matchValue;
    int32_t i, j, idx, length, matchLength;
    UChar c;

    if(cx==NULL) {
        return 0; /* no extension data, no match */
    }

    /* trie lookup of firstCP */
    idx=firstCP>>10; /* stage 1 index */
    if(idx>=cx[UCNV_EXT_FROM_U_STAGE_1_LENGTH]) {
        return 0; /* the first code point is outside the trie */
    }

    stage12=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_12_INDEX, uint16_t);
    stage3=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3_INDEX, uint16_t);
    idx=UCNV_EXT_FROM_U(stage12, stage3, idx, firstCP);

    stage3b=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3B_INDEX, uint32_t);
    value=stage3b[idx];
    if(value==0) {
        return 0;
    }

    /*
     * Tests for (value&UCNV_EXT_FROM_U_RESERVED_MASK)==0:
     * Do not interpret values with reserved bits used, for forward compatibility,
     * and do not even remember intermediate results with reserved bits used.
     */

    if(UCNV_EXT_TO_U_IS_PARTIAL(value)) {
        /* partial match, enter the loop below */
        idx=(int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value);

        /* initialize */
        fromUTableUChars=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_UCHARS_INDEX, UChar);
        fromUTableValues=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_VALUES_INDEX, uint32_t);

        matchValue=0;
        i=j=matchLength=0;

        /* we must not remember fallback matches when not using fallbacks */

        /* match input units until there is a full match or the input is consumed */
        for(;;) {
            /* go to the next section */
            fromUSectionUChars=fromUTableUChars+idx;
            fromUSectionValues=fromUTableValues+idx;

            /* read first pair of the section */
            length=*fromUSectionUChars++;
            value=*fromUSectionValues++;
            if(value!=0 && extFromUUseMapping(useFallback, value, firstCP)) {
                /* remember longest match so far */
                matchValue=value;
                matchLength=2+i+j;
            }

            /* match pre[] then src[] */
            if(i<preLength) {
                c=pre[i++];
            } else if(j<srcLength) {
                c=src[j++];
            } else {
                /* all input consumed, partial match */
                if(flush || (length=(i+j))>UCNV_EXT_MAX_UCHARS) {
                    /*
                     * end of the entire input stream, stop with the longest match so far
                     * or: partial match must not be longer than UCNV_EXT_MAX_UCHARS
                     * because it must fit into state buffers
                     */
                    break;
                } else {
                    /* continue with more input next time */
                    return -(2+length);
                }
            }

            /* search for the current UChar */
            idx=ucnv_extFindFromU(fromUSectionUChars, length, c);
            if(idx<0) {
                /* no match here, stop with the longest match so far */
                break;
            } else {
                value=fromUSectionValues[idx];
                if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
                    /* partial match, continue */
                    idx=(int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value);
                } else {
                    if(extFromUUseMapping(useFallback, value, firstCP)) {
                        /* full match, stop with result */
                        matchValue=value;
                        matchLength=2+i+j;
                    } else {
                        /* full match on fallback not taken, stop with the longest match so far */
                    }
                    break;
                }
            }
        }

        if(matchLength==0) {
            /* no match at all */
            return 0;
        }
    } else /* result from firstCP trie lookup */ {
        if(extFromUUseMapping(useFallback, value, firstCP)) {
            /* full match, stop with result */
            matchValue=value;
            matchLength=2;
        } else {
            /* fallback not taken */
            return 0;
        }
    }

    /* return result */
    if(matchValue==UCNV_EXT_FROM_U_SUBCHAR1) {
        return 1; /* assert matchLength==2 */
    }

    *pMatchValue=matchValue;
    return matchLength;
}